

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::getIllConditioning
          (Highs *this,HighsIllConditioning *ill_conditioning,bool constraint,HighsInt method,
          double ill_conditioning_bound)

{
  HighsStatus HVar1;
  
  if ((this->basis_).valid != false) {
    HVar1 = computeIllConditioning(this,ill_conditioning,constraint,method,ill_conditioning_bound);
    return HVar1;
  }
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
               "Cannot get ill-conditioning without a valid basis\n");
  return kError;
}

Assistant:

HighsStatus Highs::getIllConditioning(HighsIllConditioning& ill_conditioning,
                                      const bool constraint,
                                      const HighsInt method,
                                      const double ill_conditioning_bound) {
  if (!basis_.valid) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Cannot get ill-conditioning without a valid basis\n");
    return HighsStatus::kError;
  }
  return computeIllConditioning(ill_conditioning, constraint, method,
                                ill_conditioning_bound);
}